

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svm_helper.c
# Opt level: O1

void helper_vmrun_x86_64(CPUX86State *env,int aflag,int next_eip_addend)

{
  CPUState *cs_00;
  byte *pbVar1;
  target_ulong tVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  uint uVar8;
  ulong uVar9;
  CPUX86State *__mptr;
  CPUState *cs;
  
  cs_00 = (CPUState *)(env[-6].mtrr_var + 4);
  if ((env->hflags & 0x200000) != 0) {
    helper_vmrun_x86_64_cold_1();
  }
  uVar7 = (env->gdt).base;
  uVar9 = env->regs[0] & 0xffffffff;
  if (aflag == 2) {
    uVar9 = env->regs[0];
  }
  env->vm_vmcb = uVar9;
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x468,uVar7);
  x86_stl_phys_x86_64(cs_00,env->vm_hsave + 0x464,(env->gdt).limit);
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x488,(env->idt).base);
  x86_stl_phys_x86_64(cs_00,env->vm_hsave + 0x484,(env->idt).limit);
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x558,env->cr[0]);
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x640,env->cr[2]);
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x550,env->cr[3]);
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x548,env->cr[4]);
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x568,env->dr[6]);
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x560,env->dr[7]);
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x4d0,env->efer);
  uVar7 = env->vm_hsave;
  tVar2 = env->eflags;
  uVar4 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  x86_stq_phys_x86_64(cs_00,uVar7 + 0x570,
                      (ulong)((uint)tVar2 & 0xfffff32a | uVar4 | env->df & 0x400U));
  uVar7 = env->vm_hsave;
  x86_stw_phys_x86_64(cs_00,uVar7 + 0x400,env->segs[0].selector);
  x86_stq_phys_x86_64(cs_00,uVar7 + 0x408,env->segs[0].base);
  x86_stl_phys_x86_64(cs_00,uVar7 + 0x404,env->segs[0].limit);
  uVar5 = env->segs[0].flags;
  x86_stw_phys_x86_64(cs_00,uVar7 + 0x402,uVar5 >> 0xc & 0xf00 | uVar5 >> 8 & 0xff);
  uVar7 = env->vm_hsave;
  x86_stw_phys_x86_64(cs_00,uVar7 + 0x410,env->segs[1].selector);
  x86_stq_phys_x86_64(cs_00,uVar7 + 0x418,env->segs[1].base);
  x86_stl_phys_x86_64(cs_00,uVar7 + 0x414,env->segs[1].limit);
  uVar5 = env->segs[1].flags;
  x86_stw_phys_x86_64(cs_00,uVar7 + 0x412,uVar5 >> 0xc & 0xf00 | uVar5 >> 8 & 0xff);
  uVar7 = env->vm_hsave;
  x86_stw_phys_x86_64(cs_00,uVar7 + 0x420,env->segs[2].selector);
  x86_stq_phys_x86_64(cs_00,uVar7 + 0x428,env->segs[2].base);
  x86_stl_phys_x86_64(cs_00,uVar7 + 0x424,env->segs[2].limit);
  uVar5 = env->segs[2].flags;
  x86_stw_phys_x86_64(cs_00,uVar7 + 0x422,uVar5 >> 0xc & 0xf00 | uVar5 >> 8 & 0xff);
  uVar7 = env->vm_hsave;
  x86_stw_phys_x86_64(cs_00,uVar7 + 0x430,env->segs[3].selector);
  x86_stq_phys_x86_64(cs_00,uVar7 + 0x438,env->segs[3].base);
  x86_stl_phys_x86_64(cs_00,uVar7 + 0x434,env->segs[3].limit);
  uVar5 = env->segs[3].flags;
  x86_stw_phys_x86_64(cs_00,uVar7 + 0x432,uVar5 >> 0xc & 0xf00 | uVar5 >> 8 & 0xff);
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x578,(long)next_eip_addend + env->eip);
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x5d8,env->regs[4]);
  x86_stq_phys_x86_64(cs_00,env->vm_hsave + 0x5f8,env->regs[0]);
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0xc);
  env->intercept = uVar7;
  uVar4 = x86_lduw_phys_x86_64(cs_00,env->vm_vmcb);
  env->intercept_cr_read = (uint16_t)uVar4;
  uVar4 = x86_lduw_phys_x86_64(cs_00,env->vm_vmcb + 2);
  env->intercept_cr_write = (uint16_t)uVar4;
  uVar4 = x86_lduw_phys_x86_64(cs_00,env->vm_vmcb + 4);
  env->intercept_dr_read = (uint16_t)uVar4;
  uVar4 = x86_lduw_phys_x86_64(cs_00,env->vm_vmcb + 6);
  env->intercept_dr_write = (uint16_t)uVar4;
  uVar4 = x86_ldl_phys_x86_64(cs_00,env->vm_vmcb + 8);
  env->intercept_exceptions = uVar4;
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x90);
  if ((uVar7 & 1) != 0) {
    uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0xb0);
    env->nested_cr3 = uVar7;
    *(byte *)&env->hflags2 = (byte)env->hflags2 | 0x40;
    uVar5 = (uint)env->cr[4] >> 5 & 1;
    env->nested_pg_mode = uVar5;
    if ((env->hflags & 0x4000) != 0) {
      env->nested_pg_mode = uVar5 | 2;
    }
    if ((env->efer & 0x800) != 0) {
      *(byte *)&env->nested_pg_mode = (byte)env->nested_pg_mode | 4;
    }
  }
  pbVar1 = (byte *)((long)&env->hflags + 2);
  *pbVar1 = *pbVar1 | 0x20;
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x50);
  env->tsc_offset = uVar7;
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x468);
  (env->gdt).base = uVar7;
  uVar4 = x86_ldl_phys_x86_64(cs_00,env->vm_vmcb + 0x464);
  (env->gdt).limit = uVar4;
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x488);
  (env->idt).base = uVar7;
  uVar4 = x86_ldl_phys_x86_64(cs_00,env->vm_vmcb + 0x484);
  (env->idt).limit = uVar4;
  x86_stq_phys_x86_64(cs_00,env->vm_vmcb + 0x80,0);
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x558);
  cpu_x86_update_cr0_x86_64(env,(uint32_t)uVar7);
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x548);
  cpu_x86_update_cr4_x86_64(env,(uint32_t)uVar7);
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x550);
  cpu_x86_update_cr3_x86_64(env,uVar7);
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x640);
  env->cr[2] = uVar7;
  uVar4 = x86_ldl_phys_x86_64(cs_00,env->vm_vmcb + 0x60);
  uVar5 = env->hflags2;
  uVar8 = uVar5 & 0xfffffff5;
  env->hflags2 = uVar8;
  if ((uVar4 >> 0x18 & 1) != 0) {
    env->v_tpr = (byte)uVar4 & 0xf;
    env->hflags2 = uVar8 | 8;
    if ((env->eflags & 0x200) != 0) {
      env->hflags2 = uVar5 | 10;
    }
  }
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x4d0);
  env->efer = uVar7;
  env->hflags = ((uint)uVar7 & 0x1000) << 8 | ((uint)uVar7 & 0x400) << 4 | env->hflags & 0xffefbfff;
  env->eflags = 0;
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x570);
  uVar5 = (uint)uVar7;
  env->cc_src = (ulong)(uVar5 & 0x8d5);
  env->cc_op = 1;
  env->df = 1 - (uVar5 >> 9 & 2);
  env->eflags = (ulong)((uint)env->eflags & 0xcd5) + ((long)(int)uVar5 & 0xfffffffffffff328U) + 2;
  svm_load_seg_cache(env,env->vm_vmcb + 0x400,0);
  svm_load_seg_cache(env,env->vm_vmcb + 0x410,1);
  svm_load_seg_cache(env,env->vm_vmcb + 0x420,2);
  svm_load_seg_cache(env,env->vm_vmcb + 0x430,3);
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x578);
  env->eip = uVar7;
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x5d8);
  env->regs[4] = uVar7;
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x5f8);
  env->regs[0] = uVar7;
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x560);
  env->dr[7] = uVar7;
  uVar7 = x86_ldq_phys_x86_64(cs_00,env->vm_vmcb + 0x568);
  env->dr[6] = uVar7;
  uVar3 = x86_ldub_phys_x86_64(cs_00,env->vm_vmcb + 0x5c);
  if (uVar3 == '\x01') {
    tlb_flush_x86_64(cs_00);
  }
  *(byte *)&env->hflags2 = (byte)env->hflags2 | 1;
  if ((uVar4 >> 8 & 1) != 0) {
    pbVar1 = (byte *)((long)&env[-6].mtrr_var[5].mask + 5);
    *pbVar1 = *pbVar1 | 1;
  }
  uVar4 = x86_ldl_phys_x86_64(cs_00,env->vm_vmcb + 0xa8);
  if (-1 < (int)uVar4) {
switchD_00525a35_caseD_1:
    return;
  }
  uVar6 = x86_ldl_phys_x86_64(cs_00,env->vm_vmcb + 0xac);
  switch(uVar4 >> 8 & 7) {
  case 0:
    *(uint32_t *)((long)env[-1].hi16_zmm_regs + 0x3f0) = uVar4 & 0xff;
    env->error_code = uVar6;
    env->exception_is_int = 0;
    env->exception_next_eip = 0xffffffffffffffff;
    do_interrupt_x86_hardirq_x86_64(env,uVar4 & 0xff,1);
    return;
  default:
    goto switchD_00525a35_caseD_1;
  case 2:
    *(undefined4 *)((long)env[-1].hi16_zmm_regs + 0x3f0) = 2;
    env->error_code = uVar6;
    env->exception_is_int = 0;
    break;
  case 3:
    *(uint32_t *)((long)env[-1].hi16_zmm_regs + 0x3f0) = uVar4 & 0xff;
    env->error_code = uVar6;
    env->exception_is_int = 0;
    env->exception_next_eip = 0xffffffffffffffff;
    goto LAB_00525aef;
  case 4:
    *(uint32_t *)((long)env[-1].hi16_zmm_regs + 0x3f0) = uVar4 & 0xff;
    env->error_code = uVar6;
    env->exception_is_int = 1;
  }
  env->exception_next_eip = env->eip;
LAB_00525aef:
  cpu_loop_exit_x86_64(cs_00);
}

Assistant:

void helper_vmrun(CPUX86State *env, int aflag, int next_eip_addend)
{
    CPUState *cs = env_cpu(env);
    target_ulong addr;
    uint64_t nested_ctl;
    uint32_t event_inj;
    uint32_t int_ctl;

    cpu_svm_check_intercept_param(env, SVM_EXIT_VMRUN, 0, GETPC());

    if (aflag == 2) {
        addr = env->regs[R_EAX];
    } else {
        addr = (uint32_t)env->regs[R_EAX];
    }

    // qemu_log_mask(CPU_LOG_TB_IN_ASM, "vmrun! " TARGET_FMT_lx "\n", addr);

    env->vm_vmcb = addr;

    /* save the current CPU state in the hsave page */
    x86_stq_phys(cs, env->vm_hsave + offsetof(struct vmcb, save.gdtr.base),
             env->gdt.base);
    x86_stl_phys(cs, env->vm_hsave + offsetof(struct vmcb, save.gdtr.limit),
             env->gdt.limit);

    x86_stq_phys(cs, env->vm_hsave + offsetof(struct vmcb, save.idtr.base),
             env->idt.base);
    x86_stl_phys(cs, env->vm_hsave + offsetof(struct vmcb, save.idtr.limit),
             env->idt.limit);

    x86_stq_phys(cs,
             env->vm_hsave + offsetof(struct vmcb, save.cr0), env->cr[0]);
    x86_stq_phys(cs,
             env->vm_hsave + offsetof(struct vmcb, save.cr2), env->cr[2]);
    x86_stq_phys(cs,
             env->vm_hsave + offsetof(struct vmcb, save.cr3), env->cr[3]);
    x86_stq_phys(cs,
             env->vm_hsave + offsetof(struct vmcb, save.cr4), env->cr[4]);
    x86_stq_phys(cs,
             env->vm_hsave + offsetof(struct vmcb, save.dr6), env->dr[6]);
    x86_stq_phys(cs,
             env->vm_hsave + offsetof(struct vmcb, save.dr7), env->dr[7]);

    x86_stq_phys(cs,
             env->vm_hsave + offsetof(struct vmcb, save.efer), env->efer);
    x86_stq_phys(cs,
             env->vm_hsave + offsetof(struct vmcb, save.rflags),
             cpu_compute_eflags(env));

    svm_save_seg(env, env->vm_hsave + offsetof(struct vmcb, save.es),
                 &env->segs[R_ES]);
    svm_save_seg(env, env->vm_hsave + offsetof(struct vmcb, save.cs),
                 &env->segs[R_CS]);
    svm_save_seg(env, env->vm_hsave + offsetof(struct vmcb, save.ss),
                 &env->segs[R_SS]);
    svm_save_seg(env, env->vm_hsave + offsetof(struct vmcb, save.ds),
                 &env->segs[R_DS]);

    x86_stq_phys(cs, env->vm_hsave + offsetof(struct vmcb, save.rip),
             env->eip + next_eip_addend);
    x86_stq_phys(cs,
             env->vm_hsave + offsetof(struct vmcb, save.rsp), env->regs[R_ESP]);
    x86_stq_phys(cs,
             env->vm_hsave + offsetof(struct vmcb, save.rax), env->regs[R_EAX]);

    /* load the interception bitmaps so we do not need to access the
       vmcb in svm mode */
    env->intercept = x86_ldq_phys(cs, env->vm_vmcb + offsetof(struct vmcb,
                                                      control.intercept));
    env->intercept_cr_read = x86_lduw_phys(cs, env->vm_vmcb +
                                       offsetof(struct vmcb,
                                                control.intercept_cr_read));
    env->intercept_cr_write = x86_lduw_phys(cs, env->vm_vmcb +
                                        offsetof(struct vmcb,
                                                 control.intercept_cr_write));
    env->intercept_dr_read = x86_lduw_phys(cs, env->vm_vmcb +
                                       offsetof(struct vmcb,
                                                control.intercept_dr_read));
    env->intercept_dr_write = x86_lduw_phys(cs, env->vm_vmcb +
                                        offsetof(struct vmcb,
                                                 control.intercept_dr_write));
    env->intercept_exceptions = x86_ldl_phys(cs, env->vm_vmcb +
                                         offsetof(struct vmcb,
                                                  control.intercept_exceptions
                                                  ));

    nested_ctl = x86_ldq_phys(cs, env->vm_vmcb + offsetof(struct vmcb,
                                                          control.nested_ctl));
    if (nested_ctl & SVM_NPT_ENABLED) {
        env->nested_cr3 = x86_ldq_phys(cs,
                                env->vm_vmcb + offsetof(struct vmcb,
                                                        control.nested_cr3));
        env->hflags2 |= HF2_NPT_MASK;

        env->nested_pg_mode = 0;
        if (env->cr[4] & CR4_PAE_MASK) {
            env->nested_pg_mode |= SVM_NPT_PAE;
        }
        if (env->hflags & HF_LMA_MASK) {
            env->nested_pg_mode |= SVM_NPT_LMA;
        }
        if (env->efer & MSR_EFER_NXE) {
            env->nested_pg_mode |= SVM_NPT_NXE;
        }
    }

    /* enable intercepts */
    env->hflags |= HF_GUEST_MASK;

    env->tsc_offset = x86_ldq_phys(cs, env->vm_vmcb +
                               offsetof(struct vmcb, control.tsc_offset));

    env->gdt.base  = x86_ldq_phys(cs, env->vm_vmcb + offsetof(struct vmcb,
                                                      save.gdtr.base));
    env->gdt.limit = x86_ldl_phys(cs, env->vm_vmcb + offsetof(struct vmcb,
                                                      save.gdtr.limit));

    env->idt.base  = x86_ldq_phys(cs, env->vm_vmcb + offsetof(struct vmcb,
                                                      save.idtr.base));
    env->idt.limit = x86_ldl_phys(cs, env->vm_vmcb + offsetof(struct vmcb,
                                                      save.idtr.limit));

    /* clear exit_info_2 so we behave like the real hardware */
    x86_stq_phys(cs,
             env->vm_vmcb + offsetof(struct vmcb, control.exit_info_2), 0);

    cpu_x86_update_cr0(env, x86_ldq_phys(cs,
                                     env->vm_vmcb + offsetof(struct vmcb,
                                                             save.cr0)));
    cpu_x86_update_cr4(env, x86_ldq_phys(cs,
                                     env->vm_vmcb + offsetof(struct vmcb,
                                                             save.cr4)));
    cpu_x86_update_cr3(env, x86_ldq_phys(cs,
                                     env->vm_vmcb + offsetof(struct vmcb,
                                                             save.cr3)));
    env->cr[2] = x86_ldq_phys(cs,
                          env->vm_vmcb + offsetof(struct vmcb, save.cr2));
    int_ctl = x86_ldl_phys(cs,
                       env->vm_vmcb + offsetof(struct vmcb, control.int_ctl));
    env->hflags2 &= ~(HF2_HIF_MASK | HF2_VINTR_MASK);
    if (int_ctl & V_INTR_MASKING_MASK) {
        env->v_tpr = int_ctl & V_TPR_MASK;
        env->hflags2 |= HF2_VINTR_MASK;
        if (env->eflags & IF_MASK) {
            env->hflags2 |= HF2_HIF_MASK;
        }
    }

    cpu_load_efer(env,
                  x86_ldq_phys(cs,
                           env->vm_vmcb + offsetof(struct vmcb, save.efer)));
    env->eflags = 0;
    cpu_load_eflags(env, x86_ldq_phys(cs,
                                  env->vm_vmcb + offsetof(struct vmcb,
                                                          save.rflags)),
                    ~(CC_O | CC_S | CC_Z | CC_A | CC_P | CC_C | DF_MASK));

    svm_load_seg_cache(env, env->vm_vmcb + offsetof(struct vmcb, save.es),
                       R_ES);
    svm_load_seg_cache(env, env->vm_vmcb + offsetof(struct vmcb, save.cs),
                       R_CS);
    svm_load_seg_cache(env, env->vm_vmcb + offsetof(struct vmcb, save.ss),
                       R_SS);
    svm_load_seg_cache(env, env->vm_vmcb + offsetof(struct vmcb, save.ds),
                       R_DS);

    env->eip = x86_ldq_phys(cs,
                        env->vm_vmcb + offsetof(struct vmcb, save.rip));

    env->regs[R_ESP] = x86_ldq_phys(cs,
                                env->vm_vmcb + offsetof(struct vmcb, save.rsp));
    env->regs[R_EAX] = x86_ldq_phys(cs,
                                env->vm_vmcb + offsetof(struct vmcb, save.rax));
    env->dr[7] = x86_ldq_phys(cs,
                          env->vm_vmcb + offsetof(struct vmcb, save.dr7));
    env->dr[6] = x86_ldq_phys(cs,
                          env->vm_vmcb + offsetof(struct vmcb, save.dr6));

    /* FIXME: guest state consistency checks */

    switch (x86_ldub_phys(cs,
                      env->vm_vmcb + offsetof(struct vmcb, control.tlb_ctl))) {
    case TLB_CONTROL_DO_NOTHING:
        break;
    case TLB_CONTROL_FLUSH_ALL_ASID:
        /* FIXME: this is not 100% correct but should work for now */
        tlb_flush(cs);
        break;
    }

    env->hflags2 |= HF2_GIF_MASK;

    if (int_ctl & V_IRQ_MASK) {
        CPUState *cs = env_cpu(env);

        cs->interrupt_request |= CPU_INTERRUPT_VIRQ;
    }

    /* maybe we need to inject an event */
    event_inj = x86_ldl_phys(cs, env->vm_vmcb + offsetof(struct vmcb,
                                                 control.event_inj));
    if (event_inj & SVM_EVTINJ_VALID) {
        uint8_t vector = event_inj & SVM_EVTINJ_VEC_MASK;
        // uint16_t valid_err = event_inj & SVM_EVTINJ_VALID_ERR;
        uint32_t event_inj_err = x86_ldl_phys(cs, env->vm_vmcb +
                                          offsetof(struct vmcb,
                                                   control.event_inj_err));

        // qemu_log_mask(CPU_LOG_TB_IN_ASM, "Injecting(%#hx): ", valid_err);
        /* FIXME: need to implement valid_err */
        switch (event_inj & SVM_EVTINJ_TYPE_MASK) {
        case SVM_EVTINJ_TYPE_INTR:
            cs->exception_index = vector;
            env->error_code = event_inj_err;
            env->exception_is_int = 0;
            env->exception_next_eip = -1;
            // qemu_log_mask(CPU_LOG_TB_IN_ASM, "INTR");
            /* XXX: is it always correct? */
            do_interrupt_x86_hardirq(env, vector, 1);
            break;
        case SVM_EVTINJ_TYPE_NMI:
            cs->exception_index = EXCP02_NMI;
            env->error_code = event_inj_err;
            env->exception_is_int = 0;
            env->exception_next_eip = env->eip;
            // qemu_log_mask(CPU_LOG_TB_IN_ASM, "NMI");
            cpu_loop_exit(cs);
            break;
        case SVM_EVTINJ_TYPE_EXEPT:
            cs->exception_index = vector;
            env->error_code = event_inj_err;
            env->exception_is_int = 0;
            env->exception_next_eip = -1;
            // qemu_log_mask(CPU_LOG_TB_IN_ASM, "EXEPT");
            cpu_loop_exit(cs);
            break;
        case SVM_EVTINJ_TYPE_SOFT:
            cs->exception_index = vector;
            env->error_code = event_inj_err;
            env->exception_is_int = 1;
            env->exception_next_eip = env->eip;
            // qemu_log_mask(CPU_LOG_TB_IN_ASM, "SOFT");
            cpu_loop_exit(cs);
            break;
        }
        // qemu_log_mask(CPU_LOG_TB_IN_ASM, " %#x %#x\n", cs->exception_index,
        //               env->error_code);
    }
}